

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O0

Own<kj::NetworkAddress> * __thiscall
kj::Own<kj::NetworkAddress>::operator=(Own<kj::NetworkAddress> *this,Own<kj::NetworkAddress> *other)

{
  Disposer *this_00;
  NetworkAddress *object;
  NetworkAddress *ptrCopy;
  Disposer *disposerCopy;
  Own<kj::NetworkAddress> *other_local;
  Own<kj::NetworkAddress> *this_local;
  
  this_00 = this->disposer;
  object = this->ptr;
  this->disposer = other->disposer;
  this->ptr = other->ptr;
  other->ptr = (NetworkAddress *)0x0;
  if (object != (NetworkAddress *)0x0) {
    Disposer::dispose<kj::NetworkAddress>(this_00,object);
  }
  return this;
}

Assistant:

inline Own& operator=(Own&& other) {
    // Move-assingnment operator.

    // Careful, this might own `other`.  Therefore we have to transfer the pointers first, then
    // dispose.
    const Disposer* disposerCopy = disposer;
    T* ptrCopy = ptr;
    disposer = other.disposer;
    ptr = other.ptr;
    other.ptr = nullptr;
    if (ptrCopy != nullptr) {
      disposerCopy->dispose(const_cast<RemoveConst<T>*>(ptrCopy));
    }
    return *this;
  }